

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plaMan.c
# Opt level: O3

Vec_Bit_t * Pla_GenRandom(int nVars,int nNums,int fNonZero)

{
  uint uVar1;
  Vec_Bit_t *pVVar2;
  int *__s;
  int iVar3;
  bool bVar4;
  size_t __size;
  int iVar5;
  int iVar6;
  int local_40;
  
  iVar3 = 1 << ((byte)nVars & 0x1f);
  iVar6 = (iVar3 >> 5) + (uint)((uint)nVars < 5);
  pVVar2 = (Vec_Bit_t *)malloc(0x10);
  iVar5 = iVar6 * 0x20;
  pVVar2->nCap = iVar5;
  if (iVar6 == 0) {
    __size = 0;
    __s = (int *)0x0;
  }
  else {
    __size = (long)iVar6 << 2;
    __s = (int *)malloc(__size);
  }
  pVVar2->pArray = __s;
  pVVar2->nSize = iVar5;
  memset(__s,0,__size);
  if (0x1d < nVars - 1U) {
    __assert_fail("nVars > 0 && nVars <= 30",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                  ,0x9a,"Vec_Bit_t *Pla_GenRandom(int, int, int)");
  }
  if ((nNums < 1) || ((uint)nNums >> ((byte)(nVars - 1U) & 0x1f) != 0)) {
    __assert_fail("nNums > 0 && nNums < (1 << (nVars - 1))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/pla/plaMan.c"
                  ,0x9b,"Vec_Bit_t *Pla_GenRandom(int, int, int)");
  }
  local_40 = 0;
  bVar4 = true;
  do {
    while( true ) {
      uVar1 = Gia_ManRandom(0);
      uVar1 = uVar1 & iVar3 - 1U;
      if (uVar1 != 0 || fNonZero == 0) break;
LAB_003f8b86:
      if (!bVar4) {
        return pVVar2;
      }
    }
    if (((int)uVar1 < 0) || (iVar5 <= (int)uVar1)) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecBit.h"
                    ,0x121,"int Vec_BitEntry(Vec_Bit_t *, int)");
    }
    if (((uint)__s[uVar1 >> 5] >> (uVar1 & 0x1f) & 1) != 0) goto LAB_003f8b86;
    __s[uVar1 >> 5] = __s[uVar1 >> 5] | 1 << ((byte)uVar1 & 0x1f);
    local_40 = local_40 + 1;
    bVar4 = local_40 < nNums;
    if (local_40 == nNums) {
      return pVVar2;
    }
  } while( true );
}

Assistant:

Vec_Bit_t * Pla_GenRandom( int nVars, int nNums, int fNonZero )
{
    int Mint, Count = 0;
    Vec_Bit_t * vBits = Vec_BitStart( 1 << nVars );
    assert( nVars > 0 && nVars <= 30 );
    assert( nNums > 0 && nNums < (1 << (nVars - 1)) );
    while ( Count < nNums )
    {
        Mint = Gia_ManRandom(0) & ((1 << nVars) - 1);
        if ( fNonZero && Mint == 0 )
            continue;
        if ( Vec_BitEntry(vBits, Mint) )
            continue;
        Vec_BitWriteEntry( vBits, Mint, 1 );
        Count++;
    }
    return vBits;
}